

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Data
          (Data<QHashPrivate::Node<QString,_QVariant>_> *this,
          Data<QHashPrivate::Node<QString,_QVariant>_> *other,size_t reserved)

{
  ulong uVar1;
  Span *pSVar2;
  ulong uVar3;
  Node<QString,_QVariant> *this_00;
  long lVar4;
  ulong uVar5;
  long lVar6;
  size_t numBuckets;
  Node<QString,_QVariant> *key;
  long in_FS_OFFSET;
  R RVar7;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  numBuckets = 0x80;
  if (0x40 < reserved) {
    if (reserved >> 0x3e == 0) {
      lVar4 = 0x3f;
      if (reserved != 0) {
        for (; reserved >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar4 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  this->numBuckets = numBuckets;
  RVar7 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar7.spans;
  uVar1 = other->numBuckets;
  lVar4 = 0;
  for (uVar5 = 0; uVar5 != uVar1 >> 7; uVar5 = uVar5 + 1) {
    pSVar2 = other->spans;
    for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 1) {
      uVar3 = (ulong)pSVar2->offsets[lVar6 + lVar4];
      if (uVar3 != 0xff) {
        key = (Node<QString,_QVariant> *)(pSVar2[uVar5].entries + uVar3);
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<QString>(this,(QString *)key);
        this_00 = Bucket::insert(&local_48);
        Node<QString,_QVariant>::Node(this_00,key);
      }
    }
    lVar4 = lVar4 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }